

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.cc
# Opt level: O0

void __thiscall
double_conversion::Bignum::AssignPowerUInt16(Bignum *this,uint16_t base,int power_exponent)

{
  char cVar1;
  Bignum *this_00;
  uint in_EDX;
  ushort in_SI;
  Bignum *in_RDI;
  bool high_bits_zero;
  uint64_t base_bits_mask;
  uint64_t max_32bits;
  bool delayed_multiplication;
  uint64_t this_value;
  int mask;
  int final_size;
  int tmp_base;
  int bit_size;
  int shifts;
  int in_stack_ffffffffffffff9c;
  undefined7 in_stack_ffffffffffffffa0;
  undefined1 uVar2;
  undefined7 in_stack_ffffffffffffffb0;
  undefined1 in_stack_ffffffffffffffb7;
  uint in_stack_ffffffffffffffcc;
  uint local_24;
  uint local_1c;
  undefined2 in_stack_fffffffffffffff4;
  
  if (in_EDX == 0) {
    AssignUInt16((Bignum *)CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0),
                 (uint16_t)((ulong)in_RDI >> 0x30));
  }
  else {
    Zero(in_RDI);
    for (; (in_SI & 1) == 0; in_SI = (ushort)((int)(uint)in_SI >> 1)) {
    }
    cVar1 = '\0';
    for (local_1c = (uint)in_SI; local_1c != 0; local_1c = (int)local_1c >> 1) {
      cVar1 = cVar1 + '\x01';
    }
    EnsureCapacity(0);
    for (local_24 = 1; (int)local_24 <= (int)in_EDX; local_24 = local_24 << 1) {
    }
    this_00 = (Bignum *)(ulong)in_SI;
    in_stack_ffffffffffffffcc = in_stack_ffffffffffffffcc & 0xffffff;
    for (local_24 = (int)local_24 >> 2; uVar2 = local_24 != 0 && this_00 < (Bignum *)0x100000000,
        local_24 != 0 && this_00 < (Bignum *)0x100000000; local_24 = (int)local_24 >> 1) {
      this_00 = (Bignum *)((long)this_00 * (long)this_00);
      if ((in_EDX & local_24) != 0) {
        in_stack_ffffffffffffffb7 =
             ((ulong)this_00 & ((1L << (0x40U - cVar1 & 0x3f)) - 1U ^ 0xffffffffffffffff)) == 0;
        if ((bool)in_stack_ffffffffffffffb7) {
          this_00 = (Bignum *)((ulong)in_SI * (long)this_00);
        }
        else {
          in_stack_ffffffffffffffcc = CONCAT13(1,(int3)in_stack_ffffffffffffffcc);
        }
      }
    }
    AssignUInt64((Bignum *)CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0),
                 (uint64_t)in_RDI);
    if ((in_stack_ffffffffffffffcc & 0x1000000) != 0) {
      MultiplyByUInt32(this_00,in_stack_ffffffffffffffcc);
    }
    for (; local_24 != 0; local_24 = (int)local_24 >> 1) {
      Square((Bignum *)CONCAT26(in_SI,CONCAT24(in_stack_fffffffffffffff4,in_EDX)));
      if ((in_EDX & local_24) != 0) {
        MultiplyByUInt32(this_00,in_stack_ffffffffffffffcc);
      }
    }
    ShiftLeft((Bignum *)CONCAT17(uVar2,in_stack_ffffffffffffffa0),in_stack_ffffffffffffff9c);
  }
  return;
}

Assistant:

void Bignum::AssignPowerUInt16(uint16_t base, const int power_exponent) {
  DOUBLE_CONVERSION_ASSERT(base != 0);
  DOUBLE_CONVERSION_ASSERT(power_exponent >= 0);
  if (power_exponent == 0) {
    AssignUInt16(1);
    return;
  }
  Zero();
  int shifts = 0;
  // We expect base to be in range 2-32, and most often to be 10.
  // It does not make much sense to implement different algorithms for counting
  // the bits.
  while ((base & 1) == 0) {
    base >>= 1;
    shifts++;
  }
  int bit_size = 0;
  int tmp_base = base;
  while (tmp_base != 0) {
    tmp_base >>= 1;
    bit_size++;
  }
  const int final_size = bit_size * power_exponent;
  // 1 extra bigit for the shifting, and one for rounded final_size.
  EnsureCapacity(final_size / kBigitSize + 2);

  // Left to Right exponentiation.
  int mask = 1;
  while (power_exponent >= mask) mask <<= 1;

  // The mask is now pointing to the bit above the most significant 1-bit of
  // power_exponent.
  // Get rid of first 1-bit;
  mask >>= 2;
  uint64_t this_value = base;

  bool delayed_multiplication = false;
  const uint64_t max_32bits = 0xFFFFFFFF;
  while (mask != 0 && this_value <= max_32bits) {
    this_value = this_value * this_value;
    // Verify that there is enough space in this_value to perform the
    // multiplication.  The first bit_size bits must be 0.
    if ((power_exponent & mask) != 0) {
      DOUBLE_CONVERSION_ASSERT(bit_size > 0);
      const uint64_t base_bits_mask =
        ~((static_cast<uint64_t>(1) << (64 - bit_size)) - 1);
      const bool high_bits_zero = (this_value & base_bits_mask) == 0;
      if (high_bits_zero) {
        this_value *= base;
      } else {
        delayed_multiplication = true;
      }
    }
    mask >>= 1;
  }
  AssignUInt64(this_value);
  if (delayed_multiplication) {
    MultiplyByUInt32(base);
  }

  // Now do the same thing as a bignum.
  while (mask != 0) {
    Square();
    if ((power_exponent & mask) != 0) {
      MultiplyByUInt32(base);
    }
    mask >>= 1;
  }

  // And finally add the saved shifts.
  ShiftLeft(shifts * power_exponent);
}